

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O0

bool __thiscall stackjit::AssemblyImage::loadFunctionBody(AssemblyImage *this,string *function)

{
  OpCodes OVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  AttributeContainer *this_00;
  unsigned_long uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar5;
  size_t *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b8;
  string local_6a0 [32];
  string local_680 [32];
  Instruction local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  string local_5e0 [32];
  Instruction local_5c0;
  _anonymous_namespace_ local_558 [32];
  pointer local_538;
  size_t j_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params_1;
  unsigned_long numParams_1;
  string calledClassType;
  _anonymous_namespace_ local_4f0 [8];
  string funcName_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  string local_4b8 [32];
  Instruction local_498;
  _anonymous_namespace_ local_430 [32];
  pointer local_410;
  size_t j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  unsigned_long numParams;
  string funcName;
  string local_3c8 [32];
  Instruction local_3a8;
  _anonymous_namespace_ local_340 [8];
  string value_4;
  string local_320 [32];
  Instruction local_300;
  _anonymous_namespace_ local_298 [8];
  string value_3;
  Instruction local_278;
  char local_209;
  undefined1 local_208 [7];
  char value_2;
  float local_19c;
  float value_1;
  int local_12c;
  int value;
  OpCodes local_ba;
  char local_b9;
  OpCodes opCode;
  ulong uStack_b8;
  InstructionFormats format;
  size_t i_1;
  unsigned_long numInst;
  string local;
  ulong local_88;
  size_t i;
  unsigned_long numLocals;
  AttributeContainer local_68;
  Function *local_30;
  Function *func;
  mapped_type bodyOffset;
  string *function_local;
  AssemblyImage *this_local;
  
  bodyOffset = (mapped_type)function;
  function_local = (string *)this;
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::count(&this->mFunctionBodyOffsets,function);
  if (sVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mFunctionBodyOffsets,function);
    func = (Function *)*pmVar3;
    local_30 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>_>
               ::operator[](&this->mFunctions,function);
    AssemblyImageLoader::loadAttributes_abi_cxx11_
              (&local_68,(AssemblyImageLoader *)this,(BinaryData *)&func,in_RCX);
    this_00 = Loader::Function::attributes_abi_cxx11_(local_30);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
    ::operator=(this_00,&local_68);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>_>
    ::~unordered_map(&local_68);
    uVar4 = anon_unknown_5::loadData<unsigned_long>(&this->mImageData,(size_t *)&func);
    for (local_88 = 0; local_88 < uVar4; local_88 = local_88 + 1) {
      (anonymous_namespace)::loadString_abi_cxx11_
                ((_anonymous_namespace_ *)&numInst,&this->mImageData,(size_t *)&func);
      this_01 = Loader::Function::localTypes_abi_cxx11_(local_30);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,(value_type *)&numInst);
      std::__cxx11::string::~string((string *)&numInst);
    }
    i_1 = anon_unknown_5::loadData<unsigned_long>(&this->mImageData,(size_t *)&func);
    for (uStack_b8 = 0; uStack_b8 < i_1; uStack_b8 = uStack_b8 + 1) {
      local_b9 = anon_unknown_5::loadData<char>(&this->mImageData,(size_t *)&func);
      local_ba = anon_unknown_5::loadData<unsigned_char>(&this->mImageData,(size_t *)&func);
      switch(local_b9) {
      case '\0':
        pvVar5 = Loader::Function::instructions(local_30);
        Loader::Instruction::make((Instruction *)&stack0xfffffffffffffed8,local_ba);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,(Instruction *)&stack0xfffffffffffffed8);
        Loader::Instruction::~Instruction((Instruction *)&stack0xfffffffffffffed8);
        break;
      case '\x01':
        local_12c = anon_unknown_5::loadData<int>(&this->mImageData,(size_t *)&func);
        pvVar5 = Loader::Function::instructions(local_30);
        Loader::Instruction::makeWithInt((Instruction *)&stack0xfffffffffffffe68,local_ba,local_12c)
        ;
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,(Instruction *)&stack0xfffffffffffffe68);
        Loader::Instruction::~Instruction((Instruction *)&stack0xfffffffffffffe68);
        break;
      case '\x02':
        local_19c = anon_unknown_5::loadData<float>(&this->mImageData,(size_t *)&func);
        pvVar5 = Loader::Function::instructions(local_30);
        Loader::Instruction::makeWithFloat((Instruction *)local_208,local_ba,local_19c);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,(Instruction *)local_208);
        Loader::Instruction::~Instruction((Instruction *)local_208);
        break;
      case '\x03':
        local_209 = anon_unknown_5::loadData<char>(&this->mImageData,(size_t *)&func);
        pvVar5 = Loader::Function::instructions(local_30);
        Loader::Instruction::makeWithChar(&local_278,local_ba,local_209);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,&local_278);
        Loader::Instruction::~Instruction(&local_278);
        break;
      case '\x04':
        (anonymous_namespace)::loadString_abi_cxx11_(local_298,&this->mImageData,(size_t *)&func);
        pvVar5 = Loader::Function::instructions(local_30);
        OVar1 = local_ba;
        std::__cxx11::string::string(local_320,(string *)local_298);
        Loader::Instruction::makeWithString(&local_300,OVar1,(string *)local_320);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,&local_300);
        Loader::Instruction::~Instruction(&local_300);
        std::__cxx11::string::~string(local_320);
        std::__cxx11::string::~string((string *)local_298);
        break;
      case '\x05':
        (anonymous_namespace)::loadString_abi_cxx11_(local_340,&this->mImageData,(size_t *)&func);
        pvVar5 = Loader::Function::instructions(local_30);
        OVar1 = local_ba;
        std::__cxx11::string::string(local_3c8,(string *)local_340);
        Loader::Instruction::makeWithStringConstant(&local_3a8,OVar1,(string *)local_3c8);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,&local_3a8);
        Loader::Instruction::~Instruction(&local_3a8);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string((string *)local_340);
        break;
      case '\x06':
        (anonymous_namespace)::loadString_abi_cxx11_
                  ((_anonymous_namespace_ *)&numParams,&this->mImageData,(size_t *)&func);
        params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)anon_unknown_5::loadData<unsigned_long>(&this->mImageData,(size_t *)&func);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j);
        for (local_410 = (pointer)0x0;
            local_410 <
            params.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage; local_410 = local_410 + 1) {
          (anonymous_namespace)::loadString_abi_cxx11_(local_430,&this->mImageData,(size_t *)&func);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&j,(value_type *)local_430);
          std::__cxx11::string::~string((string *)local_430);
        }
        pvVar5 = Loader::Function::instructions(local_30);
        std::__cxx11::string::string(local_4b8,(string *)&numParams);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_4d0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j);
        Loader::Instruction::makeCall(&local_498,(string *)local_4b8,&local_4d0);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        push_back(pvVar5,&local_498);
        Loader::Instruction::~Instruction(&local_498);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d0);
        std::__cxx11::string::~string(local_4b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&j);
        std::__cxx11::string::~string((string *)&numParams);
        break;
      case '\a':
        (anonymous_namespace)::loadString_abi_cxx11_(local_4f0,&this->mImageData,(size_t *)&func);
        (anonymous_namespace)::loadString_abi_cxx11_
                  ((_anonymous_namespace_ *)&numParams_1,&this->mImageData,(size_t *)&func);
        params_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)anon_unknown_5::loadData<unsigned_long>(&this->mImageData,(size_t *)&func);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&j_1);
        for (local_538 = (pointer)0x0;
            local_538 <
            params_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage; local_538 = local_538 + 1) {
          (anonymous_namespace)::loadString_abi_cxx11_(local_558,&this->mImageData,(size_t *)&func);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&j_1,(value_type *)local_558);
          std::__cxx11::string::~string((string *)local_558);
        }
        if (local_ba == NEW_OBJECT) {
          pvVar5 = Loader::Function::instructions(local_30);
          std::__cxx11::string::string(local_5e0,(string *)&numParams_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_5f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&j_1);
          Loader::Instruction::makeNewObject(&local_5c0,(string *)local_5e0,&local_5f8);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::push_back(pvVar5,&local_5c0);
          Loader::Instruction::~Instruction(&local_5c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5f8);
          std::__cxx11::string::~string(local_5e0);
        }
        else {
          pvVar5 = Loader::Function::instructions(local_30);
          std::__cxx11::string::string(local_680,(string *)&numParams_1);
          std::__cxx11::string::string(local_6a0,(string *)local_4f0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_6b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&j_1);
          Loader::Instruction::makeCallInstance
                    (&local_660,(string *)local_680,(string *)local_6a0,&local_6b8);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::push_back(pvVar5,&local_660);
          Loader::Instruction::~Instruction(&local_660);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_6b8);
          std::__cxx11::string::~string(local_6a0);
          std::__cxx11::string::~string(local_680);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&j_1);
        std::__cxx11::string::~string((string *)&numParams_1);
        std::__cxx11::string::~string((string *)local_4f0);
      }
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::erase(&this->mFunctionBodyOffsets,function);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AssemblyImage::loadFunctionBody(std::string function) {
		if (mFunctionBodyOffsets.count(function) > 0) {
			auto bodyOffset = mFunctionBodyOffsets[function];

			Loader::Function& func = mFunctions[function];
			func.attributes() = AssemblyImageLoader::loadAttributes(mImageData, bodyOffset);

			auto numLocals = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numLocals; i++) {
				auto local = loadString(mImageData, bodyOffset);
				func.localTypes().push_back(local);
			}

			auto numInst = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numInst; i++) {
				auto format = (Loader::InstructionFormats)loadData<char>(mImageData, bodyOffset);
				auto opCode = (OpCodes)loadData<unsigned char>(mImageData, bodyOffset);

				switch (format) {
					case Loader::InstructionFormats::OpCodeOnly:
						func.instructions().push_back(Loader::Instruction::make(opCode));
						break;
					case Loader::InstructionFormats::IntData: {
							auto value = loadData<int>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithInt(opCode, value));
						}
						break;
					case Loader::InstructionFormats::FloatData:	{
							auto value = loadData<float>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithFloat(opCode, value));
						}
						break;
					case Loader::InstructionFormats::CharData: {
							auto value = loadData<char>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithChar(opCode, value));
						}
						break;
					case Loader::InstructionFormats::StringData: {
							auto value = loadString(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithString(opCode, value));
						}
						break;
					case Loader::InstructionFormats::StringConstantData: {
							auto value = loadString(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithStringConstant(opCode, value));
						}
						break;
					case Loader::InstructionFormats::Call: {
							auto funcName = loadString(mImageData, bodyOffset);
							auto numParams = loadData<std::size_t>(mImageData, bodyOffset);
							std::vector<std::string> params;

							for (std::size_t j = 0; j < numParams; j++) {
								params.push_back(loadString(mImageData, bodyOffset));
							}

							func.instructions().push_back(Loader::Instruction::makeCall(funcName, params));
						}
						break;
					case Loader::InstructionFormats::CallInstance: {
							auto funcName = loadString(mImageData, bodyOffset);
							auto calledClassType = loadString(mImageData, bodyOffset);
							auto numParams = loadData<std::size_t>(mImageData, bodyOffset);
							std::vector<std::string> params;

							for (std::size_t j = 0; j < numParams; j++) {
								params.push_back(loadString(mImageData, bodyOffset));
							}

							if (opCode == OpCodes::NEW_OBJECT) {
								func.instructions().push_back(Loader::Instruction::makeNewObject(
									calledClassType,
									params));
							} else {
								func.instructions().push_back(Loader::Instruction::makeCallInstance(
									calledClassType,
									funcName,
									params));
							}
						}
						break;
				}
			}

			mFunctionBodyOffsets.erase(function);
			return true;
		}

		return false;
	}